

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_read_qcd(opj_j2k_t *j2k)

{
  int pos_00;
  long in_RDI;
  opj_image_t *image;
  opj_cio_t *cio;
  int pos;
  int i;
  int len;
  int in_stack_00000028;
  int in_stack_0000002c;
  opj_j2k_t *in_stack_00000030;
  long lVar1;
  opj_cio_t *cio_00;
  undefined4 local_10;
  
  cio_00 = *(opj_cio_t **)(in_RDI + 0x70);
  lVar1 = *(long *)(in_RDI + 0x58);
  cio_read(cio_00,(int)((ulong)lVar1 >> 0x20));
  pos_00 = cio_tell(cio_00);
  for (local_10 = 0; local_10 < *(uint *)(lVar1 + 0x10); local_10 = local_10 + 1) {
    cio_seek(cio_00,pos_00);
    j2k_read_qcx(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  }
  return;
}

Assistant:

static void j2k_read_qcd(opj_j2k_t *j2k) {
	int len, i, pos;

	opj_cio_t *cio = j2k->cio;
	opj_image_t *image = j2k->image;
	
	len = cio_read(cio, 2);		/* Lqcd */
	pos = cio_tell(cio);
	for (i = 0; i < image->numcomps; i++) {
		cio_seek(cio, pos);
		j2k_read_qcx(j2k, i, len - 2);
	}
}